

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

bool QObject::disconnect(QObject *sender,QMetaMethod *signal,QObject *receiver,QMetaMethod *method)

{
  bool bVar1;
  MethodType MVar2;
  int iVar3;
  QMetaObject *pQVar4;
  undefined4 extraout_var;
  char *pcVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  bool bVar6;
  long in_FS_OFFSET;
  int method_index;
  int signal_index;
  int dummy;
  int local_78;
  int local_74;
  QArrayDataPointer<char> local_70;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sender == (QObject *)0x0) ||
     (pQVar4 = method->mobj, pQVar4 != (QMetaObject *)0x0 && receiver == (QObject *)0x0)) {
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_58.context.version = 2;
      local_58.context._4_8_ = 0;
      local_58.context._12_8_ = 0;
      local_58.context.function._4_4_ = 0;
      local_58.context.category = lcConnect::category.name;
      bVar6 = false;
      QMessageLogger::warning(&local_58,"QObject::disconnect: Unexpected nullptr parameter");
      goto LAB_0028d218;
    }
  }
  else if (signal->mobj == (QMetaObject *)0x0) {
LAB_0028d166:
    if (pQVar4 != (QMetaObject *)0x0) {
      MVar2 = QMetaMethod::methodType(method);
      if (MVar2 == Constructor) {
        lcConnect();
        if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
        goto LAB_0028d215;
        local_58.context.version = 2;
        local_58.context.function._4_4_ = 0;
        local_58.context._4_8_ = 0;
        local_58.context._12_8_ = 0;
        local_58.context.category = lcConnect::category.name;
        iVar3 = (**receiver->_vptr_QObject)(receiver);
        pcVar5 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar3));
        QMetaMethod::methodSignature((QByteArray *)&local_70,method);
        if (local_70.ptr == (char *)0x0) {
          local_70.ptr = &QByteArray::_empty;
        }
        QMessageLogger::warning
                  (&local_58,"QObject::disconnect: cannot use constructor as argument %s::%s",pcVar5
                   ,local_70.ptr);
        goto LAB_0028d3aa;
      }
    }
    local_74 = -0x55555556;
    local_78 = -0x55555556;
    local_58.context.version = -0x55555556;
    QMetaObjectPrivate::memberIndexes(sender,signal,&local_74,(int *)&local_58);
    QMetaObjectPrivate::memberIndexes(receiver,method,(int *)&local_58,&local_78);
    if (local_74 == -1 && signal->mobj != (QMetaObject *)0x0) {
      lcConnect();
      if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
        local_58.context.version = 2;
        local_58.context._4_8_ = 0;
        local_58.context._12_8_ = 0;
        local_58.context.function._4_4_ = 0;
        local_58.context.category = lcConnect::category.name;
        QMetaMethod::methodSignature((QByteArray *)&local_70,signal);
        if (local_70.ptr == (char *)0x0) {
          local_70.ptr = &QByteArray::_empty;
        }
        iVar3 = (**sender->_vptr_QObject)(sender);
        pcVar5 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_00,iVar3));
        QMessageLogger::warning
                  (&local_58,"QObject::disconnect: signal %s not found on class %s",local_70.ptr,
                   pcVar5);
        goto LAB_0028d3aa;
      }
    }
    else {
      if ((receiver == (QObject *)0x0) || (local_78 != -1 || method->mobj == (QMetaObject *)0x0)) {
        bVar6 = false;
        bVar1 = QMetaObjectPrivate::disconnect
                          (sender,local_74,signal->mobj,receiver,local_78,(void **)0x0,DisconnectAll
                          );
        if ((bVar1) && (bVar6 = true, signal->mobj == (QMetaObject *)0x0)) {
          (*sender->_vptr_QObject[0xb])(sender,signal);
        }
        goto LAB_0028d218;
      }
      lcConnect();
      if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
        local_58.context.version = 2;
        local_58.context._4_8_ = 0;
        local_58.context._12_8_ = 0;
        local_58.context.function._4_4_ = 0;
        local_58.context.category = lcConnect::category.name;
        QMetaMethod::methodSignature((QByteArray *)&local_70,method);
        if (local_70.ptr == (char *)0x0) {
          local_70.ptr = &QByteArray::_empty;
        }
        iVar3 = (**receiver->_vptr_QObject)(receiver);
        pcVar5 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_02,iVar3));
        QMessageLogger::warning
                  (&local_58,"QObject::disconnect: method %s not found on class %s",local_70.ptr,
                   pcVar5);
        goto LAB_0028d3aa;
      }
    }
  }
  else {
    MVar2 = QMetaMethod::methodType(signal);
    if (MVar2 == Signal) {
      pQVar4 = method->mobj;
      goto LAB_0028d166;
    }
    lcConnect();
    if (((byte)lcConnect::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) == 0)
    goto LAB_0028d215;
    local_58.context.version = 2;
    local_58.context.function._4_4_ = 0;
    local_58.context._4_8_ = 0;
    local_58.context._12_8_ = 0;
    local_58.context.category = lcConnect::category.name;
    iVar3 = (**sender->_vptr_QObject)(sender);
    pcVar5 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var_01,iVar3));
    QMetaMethod::methodSignature((QByteArray *)&local_70,signal);
    if (local_70.ptr == (char *)0x0) {
      local_70.ptr = &QByteArray::_empty;
    }
    QMessageLogger::warning
              (&local_58,"QObject::%s: Attempt to %s non-signal %s::%s","disconnect","unbind",pcVar5
               ,local_70.ptr);
LAB_0028d3aa:
    QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
  }
LAB_0028d215:
  bVar6 = false;
LAB_0028d218:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QObject::disconnect(const QObject *sender, const QMetaMethod &signal,
                         const QObject *receiver, const QMetaMethod &method)
{
    if (sender == nullptr || (receiver == nullptr && method.mobj != nullptr)) {
        qCWarning(lcConnect, "QObject::disconnect: Unexpected nullptr parameter");
        return false;
    }
    if (signal.mobj) {
        if (signal.methodType() != QMetaMethod::Signal) {
            qCWarning(lcConnect, "QObject::%s: Attempt to %s non-signal %s::%s",
                     "disconnect","unbind",
                     sender->metaObject()->className(), signal.methodSignature().constData());
            return false;
        }
    }
    if (method.mobj) {
        if (method.methodType() == QMetaMethod::Constructor) {
            qCWarning(lcConnect, "QObject::disconnect: cannot use constructor as argument %s::%s",
                      receiver->metaObject()->className(), method.methodSignature().constData());
            return false;
        }
    }

    int signal_index;
    int method_index;
    {
        int dummy;
        QMetaObjectPrivate::memberIndexes(sender, signal, &signal_index, &dummy);
        QMetaObjectPrivate::memberIndexes(receiver, method, &dummy, &method_index);
    }
    // If we are here sender is not nullptr. If signal is not nullptr while signal_index
    // is -1 then this signal is not a member of sender.
    if (signal.mobj && signal_index == -1) {
        qCWarning(lcConnect, "QObject::disconnect: signal %s not found on class %s",
                  signal.methodSignature().constData(), sender->metaObject()->className());
        return false;
    }
    // If this condition is true then method is not a member of receiver.
    if (receiver && method.mobj && method_index == -1) {
        qCWarning(lcConnect, "QObject::disconnect: method %s not found on class %s",
                  method.methodSignature().constData(), receiver->metaObject()->className());
        return false;
    }

    if (!QMetaObjectPrivate::disconnect(sender, signal_index, signal.mobj, receiver, method_index, nullptr))
        return false;

    if (!signal.isValid()) {
        // The signal is a wildcard, meaning all signals were disconnected.
        // QMetaObjectPrivate::disconnect() doesn't call disconnectNotify()
        // per connection in this case. Call it once now, with an invalid
        // QMetaMethod as argument, as documented.
        const_cast<QObject *>(sender)->disconnectNotify(signal);
    }
    return true;
}